

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O2

void __thiscall SGParser::Generator::NFA::TraverseGraph(NFA *this,NFANode *seed,NodeSet *visited)

{
  pointer ppNVar1;
  iterator iVar2;
  pointer ppNVar3;
  NFANode *local_48;
  NFANode *seed_local;
  NFANode *local_38;
  NFANode *node;
  
  local_48 = seed;
  seed_local = (NFANode *)this;
  std::
  _Rb_tree<SGParser::Generator::NFANode*,SGParser::Generator::NFANode*,std::_Identity<SGParser::Generator::NFANode*>,std::less<SGParser::Generator::NFANode*>,std::allocator<SGParser::Generator::NFANode*>>
  ::_M_insert_unique<SGParser::Generator::NFANode*const&>
            ((_Rb_tree<SGParser::Generator::NFANode*,SGParser::Generator::NFANode*,std::_Identity<SGParser::Generator::NFANode*>,std::less<SGParser::Generator::NFANode*>,std::allocator<SGParser::Generator::NFANode*>>
              *)visited,&local_48);
  ppNVar1 = (local_48->LinkPtr).
            super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar3 = (local_48->LinkPtr).
                 super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppNVar3 != ppNVar1;
      ppNVar3 = ppNVar3 + 1) {
    local_38 = *ppNVar3;
    iVar2 = std::
            _Rb_tree<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::_Identity<SGParser::Generator::NFANode_*>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
            ::find(&visited->_M_t,&local_38);
    if ((_Rb_tree_header *)iVar2._M_node == &(visited->_M_t)._M_impl.super__Rb_tree_header) {
      TraverseGraph((NFA *)seed_local,local_38,visited);
    }
  }
  return;
}

Assistant:

void NFA::TraverseGraph(NFANode* seed, NodeSet& visited) const {
    // Insert node if it's not already there
    visited.insert(seed);

    for (const auto node : seed->LinkPtr) {
        // If the node is not already inserted
        if (visited.find(node) == visited.end()) {
            // Traverse the rest of the graph (traversing will also insert the node)
            TraverseGraph(node, visited);
        }
    }
}